

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  bool bVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  Argengine ae;
  Error error;
  allocator_type local_172;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_171;
  undefined1 local_170 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  long *local_148 [2];
  long local_138 [4];
  code *local_118;
  code *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  code *local_f8;
  code *local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  juzzlin::Argengine::Argengine((Argengine *)local_170,argc,argv,true);
  pcVar1 = local_170 + 0x18;
  local_168._M_dataplus._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_170 + 8),"foo","");
  __l._M_len = 1;
  __l._M_array = (iterator)(local_170 + 8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_48,__l,&local_171,&local_172);
  local_108 = 0;
  uStack_100 = 0;
  local_f0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex2/ex2.cpp:43:18)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex2/ex2.cpp:43:18)>
             ::_M_manager;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
  juzzlin::Argengine::addOption(local_170,&local_48,&local_108,0,local_c8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_48);
  if (local_168._M_dataplus._M_p != pcVar1) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_170 + 8),"bar","");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)(local_170 + 8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_78,__l_00,&local_171,&local_172);
  local_138[2] = 0;
  local_138[3] = 0;
  local_110 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex2/ex2.cpp:49:18)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/examples/ex2/ex2.cpp:49:18)>
              ::_M_manager;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
  juzzlin::Argengine::addOption(local_170,&local_78,local_138 + 2,0,local_e8);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if (local_118 != (code *)0x0) {
    (*local_118)(local_138 + 2,local_138 + 2,3);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_78);
  if (local_168._M_dataplus._M_p != pcVar1) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_170 + 8),"foo","");
  plVar3 = local_138;
  local_148[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"bar","");
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)(local_170 + 8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_a8,__l_01,&local_171,&local_172);
  juzzlin::Argengine::addConflictingOptions(local_170,&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_a8);
  lVar4 = -0x40;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
  local_168.field_2._M_allocated_capacity = 0;
  local_168.field_2._M_local_buf[8] = '\0';
  local_168._M_string_length = (size_type)(local_170 + 0x20);
  juzzlin::Argengine::parse((Error *)local_170);
  bVar5 = (int)local_168._M_dataplus._M_p != 0;
  if (bVar5) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_168._M_string_length,
                        local_168.field_2._M_allocated_capacity);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    plVar3 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    juzzlin::Argengine::printHelp();
  }
  if ((undefined1 *)local_168._M_string_length != local_170 + 0x20) {
    operator_delete((void *)local_168._M_string_length,
                    CONCAT71(local_168.field_2._9_7_,local_168.field_2._M_local_buf[8]) + 1);
  }
  juzzlin::Argengine::~Argengine((Argengine *)local_170);
  return (uint)bVar5;
}

Assistant:

int main(int argc, char ** argv)
{
    // Instantiate Argengine and give it the raw argument data.
    Argengine ae(argc, argv);

    // Add a minimal dummy option "foo".
    ae.addOption(
      { "foo" }, [] {
          std::cout << "Foo enabled!" << std::endl;
      });

    // Add a minimal dummy option "bar".
    ae.addOption(
      { "bar" }, [] {
          std::cout << "Bar enabled!" << std::endl;
      });

    // Set "foo" and "bar" as conflicting options.
    ae.addConflictingOptions({ "foo", "bar" });

    // Parse the arguments and store possible error to variable error.
    Argengine::Error error;
    ae.parse(error);

    // Check error and print the possible error message.
    if (error.code != Argengine::Error::Code::Ok) {
        std::cerr << error.message << std::endl
                  << std::endl;
        ae.printHelp(); // Print the auto-generated help.
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}